

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O1

bool __thiscall
draco::PlyReader::ParseElementData(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  iterator iVar1;
  uint uVar2;
  size_t __n;
  long lVar3;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar4;
  long lVar5;
  pointer pPVar6;
  long lVar7;
  long lVar8;
  int64_t num_entries;
  long local_50;
  ulong local_48;
  pointer local_40;
  ulong local_38;
  
  pPVar6 = (this->elements_).
           super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)pPVar6[element_index].num_entries_) {
    pPVar6 = pPVar6 + element_index;
    local_48 = 0;
    local_40 = pPVar6;
    do {
      lVar3 = *(long *)&(pPVar6->properties_).
                        super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                        _M_impl;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&(pPVar6->properties_).
                                           super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                                   + 8) - lVar3) >> 5) * -0x55555555) {
        lVar8 = 0x38;
        lVar7 = 0;
        do {
          pvVar4 = (vector<unsigned_char,std::allocator<unsigned_char>> *)(lVar8 + lVar3 + -0x18);
          if (*(int *)(lVar8 + lVar3 + 0x20) == 0) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
                      (pvVar4,*(undefined8 *)(lVar3 + -0x10 + lVar8),buffer->data_ + buffer->pos_,
                       buffer->data_ + buffer->pos_ + *(int *)(lVar3 + 0x1c + lVar8));
            buffer->pos_ = buffer->pos_ + (long)*(int *)(lVar3 + 0x1c + lVar8);
          }
          else {
            local_50 = 0;
            __n = (size_t)*(int *)(lVar3 + 0x24 + lVar8);
            lVar5 = buffer->pos_ + __n;
            if (lVar5 <= buffer->data_size_) {
              memcpy(&local_50,buffer->data_ + buffer->pos_,__n);
              buffer->pos_ = lVar5;
            }
            local_38 = (ulong)(*(long *)(lVar3 + -0x10 + lVar8) - *(long *)(lVar3 + -0x18 + lVar8))
                       / (ulong)(long)*(int *)(lVar3 + 0x1c + lVar8);
            iVar1._M_current = *(long **)(lVar3 + 8 + lVar8);
            if (iVar1._M_current == *(long **)(lVar3 + 0x10 + lVar8)) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        ((vector<long,_std::allocator<long>_> *)(lVar8 + lVar3),iVar1,
                         (long *)&local_38);
            }
            else {
              *iVar1._M_current = local_38;
              *(long **)(lVar3 + 8 + lVar8) = iVar1._M_current + 1;
            }
            iVar1._M_current = *(long **)(lVar3 + 8 + lVar8);
            if (iVar1._M_current == *(long **)(lVar3 + 0x10 + lVar8)) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)(lVar8 + lVar3),iVar1,&local_50);
            }
            else {
              *iVar1._M_current = local_50;
              *(long **)(lVar3 + 8 + lVar8) = iVar1._M_current + 1;
            }
            lVar5 = *(int *)(lVar3 + 0x1c + lVar8) * local_50;
            std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
                      (pvVar4,*(undefined8 *)(lVar3 + -0x10 + lVar8),buffer->data_ + buffer->pos_,
                       buffer->data_ + buffer->pos_ + lVar5);
            buffer->pos_ = buffer->pos_ + lVar5;
            pPVar6 = local_40;
          }
          lVar7 = lVar7 + 1;
          lVar3 = *(long *)&(pPVar6->properties_).
                            super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                            ._M_impl;
          lVar8 = lVar8 + 0x60;
        } while (lVar7 < (int)((ulong)((long)*(pointer *)
                                              ((long)&(pPVar6->properties_).
                                                                                                            
                                                  super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                                              + 8) - lVar3) >> 5) * -0x55555555);
      }
      uVar2 = (int)local_48 + 1;
      local_48 = (ulong)uVar2;
    } while ((int)uVar2 < (int)pPVar6->num_entries_);
  }
  return true;
}

Assistant:

bool PlyReader::ParseElementData(DecoderBuffer *buffer, int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      if (prop.is_list()) {
        // Parse the number of entries for the list element.
        int64_t num_entries = 0;
        buffer->Decode(&num_entries, prop.list_data_type_num_bytes());
        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
        // Read and store the actual property data
        const int64_t num_bytes_to_read =
            prop.data_type_num_bytes() * num_entries;
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + num_bytes_to_read);
        buffer->Advance(num_bytes_to_read);
      } else {
        // Non-list property
        prop.data_.insert(prop.data_.end(), buffer->data_head(),
                          buffer->data_head() + prop.data_type_num_bytes());
        buffer->Advance(prop.data_type_num_bytes());
      }
    }
  }
  return true;
}